

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O2

bool __thiscall
google::protobuf::io::ConcatenatingInputStream::Next
          (ConcatenatingInputStream *this,void **data,int *size)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  
  iVar2 = this->stream_count_;
  while (0 < iVar2) {
    iVar1 = (*(*this->streams_)->_vptr_ZeroCopyInputStream[2])(*this->streams_,data,size);
    if ((char)iVar1 != '\0') break;
    iVar2 = (*(*this->streams_)->_vptr_ZeroCopyInputStream[5])();
    this->bytes_retired_ = this->bytes_retired_ + CONCAT44(extraout_var,iVar2);
    this->streams_ = this->streams_ + 1;
    iVar2 = this->stream_count_ + -1;
    this->stream_count_ = iVar2;
  }
  return 0 < iVar2;
}

Assistant:

bool ConcatenatingInputStream::Next(const void** data, int* size) {
  while (stream_count_ > 0) {
    if (streams_[0]->Next(data, size)) return true;

    // That stream is done.  Advance to the next one.
    bytes_retired_ += streams_[0]->ByteCount();
    ++streams_;
    --stream_count_;
  }

  // No more streams.
  return false;
}